

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSpaceQueryResultsFB *value)

{
  NextChainResult NVar1;
  XrResult XVar2;
  long lVar3;
  ulong uVar4;
  allocator local_169;
  GenValidUsageXrInstanceInfo *local_168;
  string *local_160;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_158;
  allocator local_149;
  string local_148;
  string error_message;
  string local_108;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  
  XVar2 = XR_SUCCESS;
  local_168 = instance_info;
  local_160 = command_name;
  local_158 = objects_info;
  if (value->type != XR_TYPE_SPACE_QUERY_RESULTS_FB) {
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSpaceQueryResultsFB",value->type,
               "VUID-XrSpaceQueryResultsFB-type-type",XR_TYPE_SPACE_QUERY_RESULTS_FB,
               "XR_TYPE_SPACE_QUERY_RESULTS_FB");
  }
  if (!check_pnext) goto LAB_00189bd9;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar1 = ValidateNextChain(local_168,local_160,local_158,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_148);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_148,local_168,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::string
              ((string *)&local_148,"VUID-XrSpaceQueryResultsFB-next-unique",&local_169);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_78,local_158);
    std::__cxx11::string::string
              ((string *)&local_108,
               "Multiple structures of the same type(s) in \"next\" chain for XrSpaceQueryResultsFB struct"
               ,&local_149);
    CoreValidLogMessage(local_168,&local_148,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_160,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_78,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_78);
    std::__cxx11::string::~string((string *)&local_148);
LAB_00189ba4:
    std::__cxx11::string::~string((string *)&error_message);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrSpaceQueryResultsFB-next-next",
               (allocator *)&local_108);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_60,local_158);
    std::__cxx11::string::string
              ((string *)&local_148,
               "Invalid structure(s) in \"next\" chain for XrSpaceQueryResultsFB struct \"next\"",
               &local_169);
    CoreValidLogMessage(local_168,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_160,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_60,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_60);
    goto LAB_00189ba4;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_00189bd9:
  if (check_members && XVar2 == XR_SUCCESS) {
    if (value->resultCapacityInput == 0) {
      if (value->results == (XrSpaceQueryResultFB *)0x0) {
        return XR_SUCCESS;
      }
    }
    else if (value->results == (XrSpaceQueryResultFB *)0x0) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrSpaceQueryResultsFB-results-parameter",
                 (allocator *)&local_108);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_90,local_158);
      std::__cxx11::string::string
                ((string *)&local_148,
                 "Structure XrSpaceQueryResultsFB member resultCapacityInput is NULL, but value->resultCapacityInput is greater than 0"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(local_168,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_160,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_90,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_90);
      std::__cxx11::string::~string((string *)&error_message);
      return XR_ERROR_VALIDATION_FAILURE;
    }
    uVar4 = 0xffffffffffffffff;
    lVar3 = 0;
    do {
      uVar4 = uVar4 + 1;
      if (value->resultCapacityInput <= uVar4) {
        return XR_SUCCESS;
      }
      XVar2 = ValidateXrStruct(local_168,local_160,local_158,true,false,
                               (XrSpaceQueryResultFB *)((value->results->uuid).data + lVar3 + -8));
      lVar3 = lVar3 + 0x18;
    } while (XVar2 == XR_SUCCESS);
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrSpaceQueryResultsFB-results-parameter",
               (allocator *)&local_108);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_a8,local_158);
    std::__cxx11::string::string
              ((string *)&local_148,"Structure XrSpaceQueryResultsFB member results is invalid",
               (allocator *)&valid_ext_structs);
    CoreValidLogMessage(local_168,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_160,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_a8,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_a8);
    std::__cxx11::string::~string((string *)&error_message);
  }
  return XVar2;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSpaceQueryResultsFB* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SPACE_QUERY_RESULTS_FB) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSpaceQueryResultsFB",
                             value->type, "VUID-XrSpaceQueryResultsFB-type-type", XR_TYPE_SPACE_QUERY_RESULTS_FB, "XR_TYPE_SPACE_QUERY_RESULTS_FB");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSpaceQueryResultsFB-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSpaceQueryResultsFB struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSpaceQueryResultsFB : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSpaceQueryResultsFB-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSpaceQueryResultsFB struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Optional array must be non-NULL when value->resultCapacityInput is non-zero
    if (0 != value->resultCapacityInput && nullptr == value->results) {
        CoreValidLogMessage(instance_info, "VUID-XrSpaceQueryResultsFB-results-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSpaceQueryResultsFB member resultCapacityInput is NULL, but value->resultCapacityInput is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->results) {
        for (uint32_t value_results_inc = 0; value_results_inc < value->resultCapacityInput; ++value_results_inc) {
            // Validate that the structure XrSpaceQueryResultFB is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, &value->results[value_results_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrSpaceQueryResultsFB-results-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrSpaceQueryResultsFB member results is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}